

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemWatcher_inotify.cpp
# Opt level: O0

bool __thiscall FileSystemWatcher::unwatch(FileSystemWatcher *this,Path *path)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  int local_2c;
  int wd;
  lock_guard<std::mutex> lock;
  Path *path_local;
  FileSystemWatcher *this_local;
  
  lock._M_device = (mutex_type *)path;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffd8,&this->mMutex);
  local_2c = -1;
  uVar1 = Map<Path,_int,_std::less<Path>_>::remove(&this->mWatchedByPath,(char *)lock._M_device);
  bVar3 = (uVar1 & 1) != 0;
  if (bVar3) {
    pcVar2 = String::constData((String *)lock._M_device);
    debug("FileSystemWatcher::unwatch(\"%s\")",pcVar2);
    Map<int,_Path,_std::less<int>_>::remove(&this->mWatchedById,(char *)&local_2c);
    inotify_rm_watch(this->mFd,local_2c);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffd8);
  return bVar3;
}

Assistant:

bool FileSystemWatcher::unwatch(const Path &path)
{
    std::lock_guard<std::mutex> lock(mMutex);
    int wd = -1;
    if (mWatchedByPath.remove(path, &wd)) {
        debug("FileSystemWatcher::unwatch(\"%s\")", path.constData());
        mWatchedById.remove(wd);
        inotify_rm_watch(mFd, wd);
        return true;
    } else {
        return false;
    }
}